

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O0

IDeckLinkAudioOutputCallback *
cdecklink_internal_callback_create_deck_link_audio_output_callback
          (void *ctx,cdecklink_audio_output_callback_render_audio_samples *cb0)

{
  cdecklink_audio_output_callback_render_audio_samples *cb0_local;
  void *ctx_local;
  
  if (cb0 == (cdecklink_audio_output_callback_render_audio_samples *)0x0) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = operator_new(0x20);
    DeckLinkAudioOutputCallback::DeckLinkAudioOutputCallback
              ((DeckLinkAudioOutputCallback *)ctx_local,ctx,cb0);
  }
  return (IDeckLinkAudioOutputCallback *)ctx_local;
}

Assistant:

IDeckLinkAudioOutputCallback* cdecklink_internal_callback_create_deck_link_audio_output_callback (void *ctx, cdecklink_audio_output_callback_render_audio_samples *cb0) {
	if (cb0 != nullptr) {
		return new DeckLinkAudioOutputCallback(ctx, cb0);
	}
	return nullptr;
}